

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(ITestInvoker *_testCase,string *_className,NameAndTags *nameAndTags,
                   SourceLineInfo *_lineInfo)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TestCaseInfo *this;
  ulong uVar2;
  long in_RCX;
  TestCase *in_RDI;
  TestCaseInfo info;
  SpecialProperties prop;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  StringRef *__range1;
  bool inTag;
  string tag;
  string desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  bool isHidden;
  undefined7 in_stack_fffffffffffffd68;
  char in_stack_fffffffffffffd6f;
  TestCaseInfo *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  TestCaseInfo *in_stack_fffffffffffffd80;
  ITestInvoker *in_stack_fffffffffffffd88;
  TestCase *in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffda0;
  iterator pbVar3;
  iterator in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  const_iterator in_stack_fffffffffffffdb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd8;
  SpecialProperties in_stack_fffffffffffffddc;
  string local_200 [200];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129 [9];
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_d0;
  SpecialProperties local_c0;
  _Alloc_hider local_b9;
  TestCaseInfo *local_b8;
  TestCaseInfo *local_a0;
  StringRef *local_98;
  byte local_89;
  string local_88 [32];
  string local_68 [63];
  byte local_29;
  long local_20;
  
  local_29 = 0;
  local_20 = in_RCX;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1379f7);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  local_89 = 0;
  local_98 = (StringRef *)(local_20 + 0x10);
  local_a0 = (TestCaseInfo *)StringRef::begin(local_98);
  this = (TestCaseInfo *)StringRef::end(local_98);
  local_b8 = this;
  for (; local_a0 != local_b8; local_a0 = (TestCaseInfo *)&(local_a0->name).field_0x1) {
    local_b9 = (local_a0->name)._M_dataplus;
    if ((local_89 & 1) == 0) {
      if (local_b9 == (_Alloc_hider)0x5b) {
        local_89 = 1;
      }
      else {
        std::__cxx11::string::operator+=(local_68,(char)local_b9);
      }
    }
    else if (local_b9 == (_Alloc_hider)0x5d) {
      in_stack_fffffffffffffddc =
           anon_unknown_1::parseSpecialTag
                     ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      local_c0 = in_stack_fffffffffffffddc;
      if ((in_stack_fffffffffffffddc & IsHidden) == None) {
        if (in_stack_fffffffffffffddc == None) {
          anon_unknown_1::enforceNotReservedTag
                    (&this->name,(SourceLineInfo *)(ulong)in_stack_fffffffffffffdd8);
        }
      }
      else {
        local_29 = 1;
      }
      bVar1 = startsWith(&in_stack_fffffffffffffd70->name,in_stack_fffffffffffffd6f);
      if ((bVar1) && (uVar2 = std::__cxx11::string::size(), 1 < uVar2)) {
        std::__cxx11::string::erase((ulong)local_88,0);
      }
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::clear();
      local_89 = 0;
    }
    else {
      std::__cxx11::string::operator+=(local_88,(char)local_b9);
    }
  }
  if ((local_29 & 1) != 0) {
    local_d0._M_allocated_capacity =
         (size_type)
         clara::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd70,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    local_12b = 1;
    in_stack_fffffffffffffdc8 = &local_120;
    in_stack_fffffffffffffdd0 = (string *)local_129;
    local_129._1_8_ = in_stack_fffffffffffffdc8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
              );
    in_stack_fffffffffffffdb8._M_current = &local_100;
    in_stack_fffffffffffffdc0 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_12a;
    local_129._1_8_ = in_stack_fffffffffffffdb8._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
              );
    local_12b = 0;
    local_e0 = &local_120;
    local_d8 = 2;
    __l._M_len = (size_type)in_stack_fffffffffffffdb0;
    __l._M_array = in_stack_fffffffffffffda8;
    local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffda0,in_stack_fffffffffffffdb8,__l);
    pbVar3 = &local_120;
    in_stack_fffffffffffffda8 = (iterator)&local_e0;
    do {
      in_stack_fffffffffffffda8 = in_stack_fffffffffffffda8 + -1;
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffda8);
    } while (in_stack_fffffffffffffda8 != pbVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_12a);
    std::allocator<char>::~allocator((allocator<char> *)local_129);
  }
  StringRef::operator_cast_to_string((StringRef *)in_stack_fffffffffffffda8);
  TestCaseInfo::TestCaseInfo
            (this,(string *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             (SourceLineInfo *)in_stack_fffffffffffffdb8._M_current);
  std::__cxx11::string::~string(local_200);
  TestCase::TestCase(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  TestCaseInfo::~TestCaseInfo(in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd80);
  return in_RDI;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }